

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O2

void __thiscall
ggml::cpu::aarch64::tensor_traits<block_q4_0,_8L,_4L,_(ggml_type)8>::forward_mul_mat_id
          (tensor_traits<block_q4_0,_8L,_4L,_(ggml_type)8> *this,ggml_compute_params *params,
          ggml_tensor *op)

{
  int iVar1;
  uint uVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  int64_t iVar6;
  long lVar7;
  size_t sVar8;
  int64_t iVar9;
  size_t sVar10;
  size_t sVar11;
  int64_t iVar12;
  long lVar13;
  ulong uVar14;
  size_t sVar15;
  size_t sVar16;
  ulong uVar17;
  ulong uVar18;
  ggml_from_float_t p_Var19;
  void *pvVar20;
  ggml_type_traits_cpu *pgVar21;
  size_t sVar22;
  size_t sVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  char *pcVar31;
  long lVar32;
  size_t sVar33;
  long lVar34;
  int64_t i11;
  ulong uVar35;
  size_t __n;
  long lVar36;
  undefined8 uVar37;
  void *pvVar38;
  int in_R9D;
  uint uVar39;
  void *pvVar40;
  long lVar41;
  
  pgVar3 = op->src[0];
  pgVar4 = op->src[1];
  pgVar5 = op->src[2];
  sVar33 = op->nb[0];
  iVar6 = pgVar3->ne[0];
  lVar7 = pgVar3->ne[1];
  lVar24 = pgVar3->ne[3];
  sVar8 = pgVar4->nb[0];
  sVar23 = pgVar3->nb[0];
  iVar9 = pgVar3->ne[2];
  sVar10 = pgVar3->nb[1];
  sVar11 = pgVar3->nb[2];
  iVar12 = pgVar4->ne[0];
  lVar13 = pgVar4->ne[1];
  uVar14 = pgVar4->ne[2];
  lVar25 = pgVar4->ne[3];
  sVar15 = pgVar4->nb[1];
  sVar16 = pgVar4->nb[2];
  lVar41 = op->ne[3];
  uVar17 = op->nb[1];
  uVar18 = op->nb[2];
  uVar30 = op->nb[3];
  iVar1 = params->ith;
  lVar32 = (long)iVar1;
  lVar29 = (long)params->nth;
  pgVar21 = ggml_get_type_traits_cpu(GGML_TYPE_Q8_0);
  p_Var19 = pgVar21->from_float;
  sVar22 = ggml_type_size(pgVar3->type);
  if (sVar23 == sVar22) {
    sVar23 = ggml_type_size(pgVar4->type);
    if (sVar8 == sVar23) {
      if (sVar33 == 4) {
        if (uVar17 < 4) {
          pcVar31 = "nb0 <= nb1";
          uVar37 = 0x1813;
        }
        else if (uVar18 < uVar17) {
          pcVar31 = "nb1 <= nb2";
          uVar37 = 0x1814;
        }
        else if (uVar30 < uVar18) {
          pcVar31 = "nb2 <= nb3";
          uVar37 = 0x1815;
        }
        else if (lVar24 == 1) {
          if (lVar25 == 1) {
            if (lVar41 == 1) {
              if (pgVar4->type == GGML_TYPE_F32) {
                uVar2 = (uint)pgVar5->ne[0];
                lVar24 = ggml_row_size(8,iVar12);
                lVar25 = lVar24 * lVar13;
                uVar39 = (uint)iVar9;
                __n = (long)(int)uVar39 * 8;
                uVar30 = lVar25 * uVar14 + 7 & 0xfffffffffffffff8;
                if ((uVar14 + 1) * __n + uVar30 <= params->wsize) {
                  pvVar20 = params->wdata;
                  lVar41 = sVar15 * lVar32;
                  pvVar38 = (void *)(lVar24 * lVar32 + (long)pvVar20);
                  for (uVar26 = 0; lVar34 = lVar32, pvVar40 = pvVar38, lVar27 = lVar41,
                      uVar26 != (~((long)uVar14 >> 0x3f) & uVar14); uVar26 = uVar26 + 1) {
                    for (; lVar34 < lVar13; lVar34 = lVar34 + lVar29) {
                      (*p_Var19)((float *)((long)pgVar4->data + lVar27),pvVar40,iVar12);
                      pvVar40 = (void *)((long)pvVar40 + lVar24 * lVar29);
                      lVar27 = lVar27 + sVar15 * lVar29;
                    }
                    lVar41 = lVar41 + sVar16;
                    pvVar38 = (void *)((long)pvVar38 + lVar25);
                  }
                  pvVar38 = (void *)((long)pvVar20 + uVar30);
                  if (iVar1 == 0) {
                    memset(pvVar38,0,__n);
                    for (lVar41 = 0; lVar41 < pgVar5->ne[1]; lVar41 = lVar41 + 1) {
                      for (uVar26 = 0; (~((int)uVar2 >> 0x1f) & uVar2) != uVar26;
                          uVar26 = uVar26 + 1) {
                        iVar1 = *(int *)((long)pgVar5->data +
                                        pgVar5->nb[0] * uVar26 + pgVar5->nb[1] * lVar41);
                        lVar34 = (long)iVar1;
                        if ((lVar34 < 0) || ((int)uVar39 <= iVar1)) {
                          pcVar31 = "i02 >= 0 && i02 < n_as";
                          uVar37 = 0x1848;
                          goto LAB_0011c10a;
                        }
                        lVar27 = *(long *)((long)pvVar38 + lVar34 * 8);
                        lVar28 = uVar14 * lVar34 * 8 + __n;
                        *(int *)((long)pvVar38 + lVar27 * 8 + lVar28) = (int)uVar26;
                        *(int *)((long)pvVar38 + lVar27 * 8 + lVar28 + 4) = (int)lVar41;
                        *(long *)((long)pvVar38 + lVar34 * 8) = lVar27 + 1;
                      }
                    }
                  }
                  ggml_barrier(params->threadpool);
                  lVar41 = (long)pvVar20 + uVar30 + __n + 4;
                  uVar30 = 0;
                  do {
                    if (uVar30 == (~((int)uVar39 >> 0x1f) & uVar39)) {
                      return;
                    }
                    uVar26 = *(ulong *)((long)pvVar38 + uVar30 * 8);
                    if (uVar26 != 0) {
                      lVar27 = (lVar7 * lVar32) / lVar29;
                      lVar28 = ((lVar32 + 1) * lVar7) / lVar29;
                      lVar34 = (lVar27 - lVar27 % 4) + 4;
                      if (lVar27 % 4 == 0) {
                        lVar34 = lVar27;
                      }
                      lVar27 = (lVar28 - lVar28 % 4) + 4;
                      if (lVar28 % 4 == 0) {
                        lVar27 = lVar28;
                      }
                      if (lVar27 <= lVar34) {
                        return;
                      }
                      pvVar40 = pgVar3->data;
                      for (uVar35 = 0; (~((long)uVar26 >> 0x3f) & uVar26) != uVar35;
                          uVar35 = uVar35 + 1) {
                        lVar28 = (long)*(int *)(lVar41 + -4 + uVar35 * 8);
                        lVar36 = (long)*(int *)(lVar41 + uVar35 * 8);
                        sVar33 = (lVar28 % lVar13) * lVar24;
                        gemv<block_q4_0,8l,4l,(ggml_type)8>
                                  ((int)iVar6,
                                   (float *)((long)op->data +
                                            lVar34 * 4 + lVar36 * uVar18 + lVar28 * uVar17),sVar33,
                                   (void *)((long)pvVar40 + lVar34 * sVar10 + sVar11 * uVar30),
                                   (void *)((long)pvVar20 + sVar33 + lVar25 * lVar36),in_R9D,
                                   (int)lVar27 - (int)lVar34);
                      }
                    }
                    lVar41 = lVar41 + uVar14 * 8;
                    uVar30 = uVar30 + 1;
                  } while( true );
                }
                pcVar31 = 
                "params->wsize >= (GGML_PAD(nbw3, sizeof(int64_t)) + n_as * sizeof(int64_t) + n_as * ne12 * sizeof(mmid_row_mapping))"
                ;
                uVar37 = 0x182b;
              }
              else {
                pcVar31 = "src1->type == GGML_TYPE_F32";
                uVar37 = 0x181b;
              }
            }
            else {
              pcVar31 = "ne3 == 1";
              uVar37 = 0x1819;
            }
          }
          else {
            pcVar31 = "ne13 == 1";
            uVar37 = 0x1818;
          }
        }
        else {
          pcVar31 = "ne03 == 1";
          uVar37 = 0x1817;
        }
      }
      else {
        pcVar31 = "nb0 == sizeof(float)";
        uVar37 = 0x1812;
      }
    }
    else {
      pcVar31 = "nb10 == ggml_type_size(src1->type)";
      uVar37 = 0x180f;
    }
  }
  else {
    pcVar31 = "nb00 == ggml_type_size(src0->type)";
    uVar37 = 0x180e;
  }
LAB_0011c10a:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
             ,uVar37,"GGML_ASSERT(%s) failed",pcVar31);
}

Assistant:

void forward_mul_mat_id(ggml_compute_params * params, ggml_tensor * op) {
        const ggml_tensor * src0 = op->src[0];
        const ggml_tensor * src1 = op->src[1];
        const ggml_tensor * ids  = op->src[2];
        ggml_tensor *       dst  = op;

        GGML_TENSOR_BINARY_OP_LOCALS

        const int ith = params->ith;
        const int nth = params->nth;

        const ggml_from_float_t from_float = ggml_get_type_traits_cpu(PARAM_TYPE)->from_float;

        // we don't support permuted src0 or src1
        GGML_ASSERT(nb00 == ggml_type_size(src0->type));
        GGML_ASSERT(nb10 == ggml_type_size(src1->type));

        // dst cannot be transposed or permuted
        GGML_ASSERT(nb0 == sizeof(float));
        GGML_ASSERT(nb0 <= nb1);
        GGML_ASSERT(nb1 <= nb2);
        GGML_ASSERT(nb2 <= nb3);

        GGML_ASSERT(ne03 == 1);
        GGML_ASSERT(ne13 == 1);
        GGML_ASSERT(ne3  == 1);

        GGML_ASSERT(src1->type == GGML_TYPE_F32);

        // row groups
        const int n_ids = ids->ne[0]; // n_expert_used
        const int n_as  = ne02;       // n_expert

        const size_t nbw1 = ggml_row_size(PARAM_TYPE, ne10);
        const size_t nbw2 = nbw1*ne11;
        const size_t nbw3 = nbw2*ne12;

        struct mmid_row_mapping {
            int32_t i1;
            int32_t i2;
        };

        GGML_ASSERT(params->wsize >= (GGML_PAD(nbw3, sizeof(int64_t)) + n_as * sizeof(int64_t) +
                                      n_as * ne12 * sizeof(mmid_row_mapping)));

        auto * wdata             = (char *)     params->wdata;
        auto * wdata_src1_end    = (char *)     wdata + GGML_PAD(nbw3, sizeof(int64_t));
        auto * matrix_row_counts = (int64_t *) (wdata_src1_end); // [n_as]

        struct mmid_row_mapping * matrix_rows = (struct mmid_row_mapping *) (matrix_row_counts + n_as);  // [n_as][ne12]

        // src1: float32 => param type
        for (int64_t i12 = 0; i12 < ne12; ++i12) {
            for (int64_t i11 = ith; i11 < ne11; i11 += nth) {
                from_float((float *)((char *) src1->data + i12 * nb12 + i11 * nb11),
                           (void *)               (wdata + i12 * nbw2 + i11 * nbw1),
                           ne10);
            }
        }

#define MMID_MATRIX_ROW(row_id, i1) matrix_rows[(row_id) * ne12 + (i1)]

        if (ith == 0) {
            // initialize matrix_row_counts
            memset(matrix_row_counts, 0, n_as * sizeof(int64_t));

            // group rows by src0 matrix
            for (int32_t iid1 = 0; iid1 < ids->ne[1]; ++iid1) {
                for (int32_t id = 0; id < n_ids; ++id) {
                    const int32_t i02 =
                        *(const int32_t *) ((const char *) ids->data + iid1 * ids->nb[1] + id * ids->nb[0]);

                    GGML_ASSERT(i02 >= 0 && i02 < n_as);

                    MMID_MATRIX_ROW(i02, matrix_row_counts[i02]) = { id, iid1 };
                    matrix_row_counts[i02] += 1;
                }
            }
        }

        ggml_barrier(params->threadpool);

        // compute each matrix multiplication in sequence
        for (int cur_a = 0; cur_a < n_as; ++cur_a) {
            const int64_t cne1 = matrix_row_counts[cur_a];

            if (cne1 == 0) {
                continue;
            }

            const auto * src0_cur = (const char *) src0->data + cur_a*nb02;

            //const int64_t nr0 = ne01; // src0 rows
            const int64_t nr1 = cne1; // src1 rows

            int64_t src0_cur_start = (ith * ne01) / nth;
            int64_t src0_cur_end   = ((ith + 1) * ne01) / nth;

            src0_cur_start = (src0_cur_start % NB_COLS) ? src0_cur_start + NB_COLS - (src0_cur_start % NB_COLS) : src0_cur_start;
            src0_cur_end   = (src0_cur_end   % NB_COLS) ? src0_cur_end   + NB_COLS - (src0_cur_end   % NB_COLS) : src0_cur_end;

            if (src0_cur_start >= src0_cur_end) {
                return;
            }

            for (int ir1 = 0; ir1 < nr1; ir1++) {
                struct mmid_row_mapping row_mapping = MMID_MATRIX_ROW(cur_a, ir1);

                const int id = row_mapping.i1; // selected expert index

                const int64_t i11 = id % ne11;
                const int64_t i12 = row_mapping.i2; // row index in src1

                const int64_t i1 = id;  // selected expert index
                const int64_t i2 = i12; // row

                const auto * src1_col = (const char *) wdata + (i11 * nbw1 + i12 * nbw2);

                gemv<BLOC_TYPE, INTER_SIZE, NB_COLS, PARAM_TYPE>(ne00,
                        (float *)((char *) dst->data + (i1 * nb1 + i2 * nb2)) + src0_cur_start, ne01,
                        src0_cur + src0_cur_start * nb01,
                        src1_col, 1, src0_cur_end - src0_cur_start);
            }
        }
#undef MMID_MATRIX_ROW
    }